

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall kj::HttpServer::listenHttp(HttpServer *this,ConnectionReceiver *port)

{
  SourceLocation location;
  SourceLocation local_58;
  undefined1 local_30 [24];
  ConnectionReceiver *port_local;
  HttpServer *this_local;
  
  port_local = port;
  this_local = this;
  listenLoop((HttpServer *)(local_30 + 8),port);
  ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_30);
  SourceLocation::SourceLocation
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"listenHttp",0x1fda,10);
  location.function = local_58.function;
  location.fileName = local_58.fileName;
  location.lineNumber = local_58.lineNumber;
  location.columnNumber = local_58.columnNumber;
  Promise<void>::exclusiveJoin((Promise<void> *)this,(Promise<void> *)(local_30 + 8),location);
  Promise<void>::~Promise((Promise<void> *)local_30);
  Promise<void>::~Promise((Promise<void> *)(local_30 + 8));
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServer::listenHttp(kj::ConnectionReceiver& port) {
  return listenLoop(port).exclusiveJoin(onDrain.addBranch());
}